

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execNegEa<(moira::Instr)86,(moira::Mode)8,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  undefined2 in_SI;
  Moira *in_RDI;
  u32 data;
  u32 ea;
  int dst;
  u32 in_stack_ffffffffffffffd8;
  u32 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined2 in_stack_fffffffffffffff4;
  
  bVar1 = readOp<(moira::Mode)8,(moira::Size)4,0ul>
                    (in_RDI,CONCAT22(in_SI,in_stack_fffffffffffffff4),
                     (u32 *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                     (u32 *)in_RDI);
  if (bVar1) {
    logic<(moira::Instr)86,(moira::Size)4>(in_RDI,in_stack_ffffffffffffffdc);
    prefetch<0ul>(in_RDI);
    writeOp<(moira::Mode)8,(moira::Size)4,4ul>
              (in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,0);
  }
  return;
}

Assistant:

void
Moira::execNegEa(u16 opcode)
{
    int dst = ( _____________xxx(opcode) );
    u32 ea, data;

    if (!readOp<M,S,STD_AE_FRAME>(dst, ea, data)) return;
    
    data = logic<I,S>(data);
    prefetch();

    writeOp<M,S,POLLIPL>(dst, ea, data);
}